

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Body.h
# Opt level: O3

Matrix3d *
RigidBodyDynamics::Body::TransformInertiaToBodyFrame
          (Matrix3d *__return_storage_ptr__,SpatialTransform *transform,Body *initial_body)

{
  double *pdVar1;
  undefined8 uVar2;
  long lVar3;
  Vector3d initial_com;
  Matrix3d inertia_initial;
  Matrix3d inertia_initial_com_rotated;
  Matrix3d inertia_initial_com;
  SpatialRigidBodyInertia initial_rbi;
  Vector3_t local_2a0;
  SpatialTransform *local_288;
  Vector3d *local_280 [2];
  undefined4 uStack_270;
  uint uStack_26c;
  undefined8 local_268;
  double local_260;
  undefined4 local_258;
  undefined4 uStack_254;
  double local_250;
  undefined8 local_248;
  SpatialTransform *local_168;
  Matrix3_t *local_160;
  SpatialTransform *local_158;
  undefined8 local_150 [9];
  Matrix3_t local_108;
  Matrix3_t local_c0;
  SpatialRigidBodyInertia local_78;
  
  local_280[1] = &transform->r;
  local_288 = transform;
  local_280[0] = &initial_body->mCenterOfMass;
  Vector3_t::
  Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&local_2a0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_288);
  Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            (&local_78,initial_body->mMass,&initial_body->mCenterOfMass,&initial_body->mInertia);
  Math::SpatialRigidBodyInertia::toMatrix(&local_78);
  lVar3 = 0;
  do {
    uVar2 = *(undefined8 *)((long)local_280 + lVar3 * 2);
    *(undefined8 *)((long)local_150 + lVar3) = *(undefined8 *)((long)&local_288 + lVar3 * 2);
    *(undefined8 *)((long)local_150 + lVar3 + 8) = uVar2;
    *(undefined8 *)((long)local_150 + lVar3 + 0x10) =
         *(undefined8 *)((long)local_280 + lVar3 * 2 + 8);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  local_260 = (initial_body->mCenterOfMass).super_Vector3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
  ;
  local_288 = (SpatialTransform *)0x0;
  local_268 = 0;
  local_250 = -local_260;
  pdVar1 = (initial_body->mCenterOfMass).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 1;
  local_258 = *(undefined4 *)pdVar1;
  uStack_254 = *(undefined4 *)
                ((long)(initial_body->mCenterOfMass).super_Vector3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + 0xc);
  uStack_270 = *(undefined4 *)
                ((initial_body->mCenterOfMass).super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                + 2);
  uStack_26c = *(uint *)((long)(initial_body->mCenterOfMass).super_Vector3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array + 0x14) ^ 0x80000000;
  local_280[1] = (Vector3d *)((ulong)*pdVar1 ^ 0x8000000000000000);
  local_248 = 0;
  local_108.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] = initial_body->mMass;
  local_108.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = (double)local_150;
  local_108.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[4] = (double)&local_288;
  local_108.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[6] = (double)&local_288;
  Matrix3_t::
  Matrix3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const>>
            (&local_c0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>_>
              *)&local_108);
  local_168 = transform;
  local_160 = &local_c0;
  local_158 = transform;
  Matrix3_t::
  Matrix3_t<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            (&local_108,
             (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_168);
  Math::parallel_axis(__return_storage_ptr__,&local_108,initial_body->mMass,&local_2a0);
  return __return_storage_ptr__;
}

Assistant:

static Math::Matrix3d TransformInertiaToBodyFrame(const Math::SpatialTransform &transform,
                                                    const Body &initial_body)
  {
    Math::Vector3d initial_com = transform.E.transpose() * initial_body.mCenterOfMass +
                               transform.r;

    Math::SpatialRigidBodyInertia initial_rbi =
      Math::SpatialRigidBodyInertia::createFromMassComInertiaC (initial_body.mMass,
          initial_body.mCenterOfMass, initial_body.mInertia);

    Math::Matrix3d inertia_initial = initial_rbi.toMatrix().block<3,3>(0,0);
    LOG << "inertia_initial = " << std::endl << inertia_initial << std::endl;

    // 1. Transform the inertia from initial origin to initial COM
    Math::Matrix3d initial_com_cross = Math::VectorCrossMatrix(
                                       initial_body.mCenterOfMass);
    Math::Matrix3d inertia_initial_com = inertia_initial - initial_body.mMass * initial_com_cross
                                       * initial_com_cross.transpose();
    LOG << "inertia_initial_com = " << std::endl << inertia_initial_com << std::endl;

    // 2. Rotate the inertia that it is aligned to the frame of this body
    Math::Matrix3d inertia_initial_com_rotated = transform.E.transpose() *
        inertia_initial_com * transform.E;
    LOG << "inertia_initial_com_rotated = " << std::endl << inertia_initial_com_rotated
        << std::endl;

    // 3. Transform inertia of initial_body to the origin of the frame of the target body
    Math::Matrix3d inertia_initial_com_rotated_this_origin = Math::parallel_axis (
          inertia_initial_com_rotated, initial_body.mMass, initial_com);
    LOG << "inertia_initial_com_rotated_this_origin = " << std::endl <<
        inertia_initial_com_rotated_this_origin << std::endl;
    return inertia_initial_com_rotated_this_origin;
  }